

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O0

char * serialize_put(char *w,SBufExt *sbx,cTValue *o)

{
  long lVar1;
  uint64_t uVar2;
  undefined4 uVar3;
  int iVar4;
  SBufExt *pSVar5;
  uint *puVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  ulong uVar12;
  uint local_3f4;
  char local_3e0;
  undefined4 local_3d0;
  uintptr_t ud;
  uint8_t *sp;
  CType *s;
  CTState *cts;
  MSize len_1;
  uint32_t idx_1;
  Node *n_2;
  GCstr *str_1;
  GCtab *dict_str;
  Node *node_1;
  cTValue *oe;
  cTValue *oa;
  uint *puStack_370;
  uint32_t idx;
  Node *n;
  TValue mto;
  Node *node;
  uint32_t hmask;
  uint32_t i_1;
  TValue *array;
  ptrdiff_t i;
  uint local_338;
  uint32_t one;
  uint32_t nhash;
  uint32_t narray;
  GCtab *t;
  uint64_t x;
  ulong uStack_318;
  MSize len;
  GCstr *str;
  cTValue *o_local;
  SBufExt *sbx_local;
  char *w_local;
  SBufExt *local_2f0;
  char *local_2e8;
  undefined4 local_2dc;
  SBufExt *local_2d8;
  char *local_2d0;
  undefined4 local_2c4;
  SBufExt *local_2c0;
  char *local_2b8;
  uint local_2ac;
  cTValue *local_2a8;
  SBufExt *local_2a0;
  undefined4 local_294;
  cTValue *local_290;
  SBufExt *local_288;
  undefined4 local_27c;
  cTValue *local_278;
  SBufExt *local_270;
  undefined4 local_264;
  SBufExt *local_260;
  char *local_258;
  undefined4 local_24c;
  SBufExt *local_248;
  byte *local_240;
  undefined4 local_234;
  SBufExt *local_230;
  char *local_228;
  uint local_21c;
  SBufExt *local_218;
  SBufExt *local_210;
  uint local_204;
  SBufExt *local_200;
  SBufExt *local_1f8;
  uint local_1ec;
  SBufExt *local_1e8;
  SBufExt *local_1e0;
  uint local_1d4;
  SBufExt *local_1d0;
  SBufExt *local_1c8;
  uint32_t local_1bc;
  SBufExt *local_1b8;
  SBufExt *local_1b0;
  uint local_1a4;
  SBufExt *local_1a0;
  SBufExt *local_198;
  uint local_18c;
  SBufExt *local_188;
  SBufExt *local_180;
  uint local_174;
  void *local_170;
  SBufExt *local_168;
  uint local_15c;
  void *local_158;
  SBufExt *local_150;
  ulong local_148;
  Node **local_140;
  ulong local_138;
  long local_130;
  Node *n_3;
  uint64_t local_120;
  long local_118;
  Node *n_1;
  uint64_t local_108;
  uint local_100;
  uint local_fc;
  long *local_f8;
  CTState *cts_1;
  uint *local_e8;
  CType *ct;
  long *local_d8;
  long local_d0;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  long local_b0;
  undefined4 local_a4;
  ulong local_a0;
  Node **local_98;
  ulong local_90;
  undefined4 local_84;
  ulong local_80;
  Node **local_78;
  char *local_70;
  Node **local_68;
  ulong local_60;
  uint local_54;
  long *local_50;
  uint *local_48;
  long *local_40;
  uint local_34;
  long *local_30;
  uint local_24;
  long *local_20;
  uint local_14;
  long *local_10;
  
  iVar4 = (int)w;
  str = (GCstr *)o;
  o_local = (cTValue *)sbx;
  sbx_local = (SBufExt *)w;
  if ((int)(o->field_4).it >> 0xf == -5) {
    uStack_318 = o->u64 & 0x7fffffffffff;
    x._4_4_ = *(uint *)(uStack_318 + 0x14);
    local_21c = x._4_4_ + 5;
    local_218 = sbx;
    local_210 = (SBufExt *)w;
    if ((uint)((int)sbx->e - iVar4) < local_21c) {
      sbx->w = w;
      local_210 = (SBufExt *)lj_buf_more2((SBuf *)sbx,local_21c);
    }
    sbx_local = local_210;
    local_18c = x._4_4_ + 0x20;
    local_188 = local_210;
    if (local_18c < 0xe0) {
      local_188 = (SBufExt *)((long)&local_210->w + 1);
      *(char *)&local_210->w = (char)local_18c;
      local_180 = local_188;
    }
    else {
      local_180 = (SBufExt *)serialize_wu124_((char *)local_210,local_18c);
    }
    pSVar5 = local_180;
    sbx_local = local_180;
    local_158 = (void *)(uStack_318 + 0x18);
    local_150 = local_180;
    local_15c = x._4_4_;
    memcpy(local_180,local_158,(ulong)x._4_4_);
    sbx_local = (SBufExt *)((long)&pSVar5->w + (ulong)local_15c);
  }
  else if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff2) {
    t = *(GCtab **)o;
    local_234 = 9;
    local_228 = w;
    if ((uint)((int)sbx->e - iVar4) < 9) {
      sbx->w = w;
      local_230 = sbx;
      local_228 = lj_buf_more2((SBuf *)sbx,9);
    }
    *local_228 = '\a';
    *(GCtab **)(local_228 + 1) = t;
    sbx_local = (SBufExt *)(local_228 + 9);
  }
  else if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffffd) {
    if ((int)(o->field_4).it >> 0xf == -0xc) {
      _nhash = o->u64 & 0x7fffffffffff;
      one = 0;
      local_338 = 0;
      i._4_4_ = 2;
      if (sbx->depth < 1) {
        lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DEPTH);
      }
      sbx->depth = sbx->depth + -1;
      if (*(int *)(_nhash + 0x30) != 0) {
        _hmask = *(long **)(_nhash + 0x10);
        array = (TValue *)(ulong)*(uint *)(_nhash + 0x30);
        do {
          array = (TValue *)((long)array - 1);
          if ((long)array < 0) break;
        } while (_hmask[(long)array] == -1);
        one = (int)array + 1;
        if ((one != 0) && (*_hmask == -1)) {
          i._4_4_ = 4;
        }
      }
      if (*(int *)(_nhash + 0x34) != 0) {
        node._0_4_ = *(uint *)(_nhash + 0x34);
        mto = *(TValue *)(_nhash + 0x28);
        for (node._4_4_ = 0; node._4_4_ <= (uint)node; node._4_4_ = node._4_4_ + 1) {
          local_338 = ((*(long *)(mto.u64 + (ulong)node._4_4_ * 0x18) == -1 ^ 0xffU) & 1) +
                      local_338;
        }
      }
      if (((sbx->dict_mt).gcptr64 != 0) && (*(long *)(_nhash + 0x20) != 0)) {
        local_138 = (sbx->L).ptr64 & 0xfffffffffffffff8;
        local_148 = *(ulong *)(_nhash + 0x20);
        local_140 = &n;
        local_a4 = 0xfffffff4;
        local_84 = 0xfffffff4;
        local_70 = "store to dead GC object";
        local_108 = (sbx->dict_mt).gcptr64;
        uVar8 = (uint)((local_148 | 0xfffa000000000000) >> 0x20);
        uVar9 = uVar8 << 0xe | uVar8 >> 0x12;
        local_fc = (uVar8 ^ (uint)local_148) - uVar9;
        n_1._4_4_ = (local_fc ^ (uVar9 << 5 | (uVar8 << 0xe) >> 0x1b)) -
                    (local_fc * 0x2000 | local_fc >> 0x13);
        local_118 = *(long *)(local_108 + 0x28);
        puStack_370 = (uint *)(local_118 + (ulong)(n_1._4_4_ & *(uint *)(local_108 + 0x34)) * 0x18);
        do {
          local_100 = n_1._4_4_;
          local_a0 = local_148;
          local_98 = local_140;
          local_90 = local_138;
          local_80 = local_148;
          local_78 = local_140;
          local_68 = local_140;
          local_60 = local_138;
          if (*(ulong *)(puStack_370 + 2) == (local_148 | 0xfffa000000000000)) {
            uVar8 = *puStack_370;
            local_264 = 6;
            local_260 = sbx;
            local_258 = w;
            if ((uint)((int)sbx->e - iVar4) < 6) {
              sbx->w = w;
              local_258 = lj_buf_more2((SBuf *)sbx,6);
            }
            sbx_local = (SBufExt *)(local_258 + 1);
            *local_258 = '\x0e';
            local_1a4 = uVar8;
            if (uVar8 < 0xe0) {
              local_1a0 = (SBufExt *)(local_258 + 2);
              *(char *)&sbx_local->w = (char)uVar8;
              local_198 = local_1a0;
            }
            else {
              local_1a0 = sbx_local;
              local_198 = (SBufExt *)serialize_wu124_((char *)sbx_local,uVar8);
            }
            sbx_local = local_198;
            break;
          }
          puStack_370 = *(uint **)(puStack_370 + 4);
        } while (puStack_370 != (uint *)0x0);
      }
      local_270 = sbx_local;
      local_278 = o_local;
      local_27c = 0xb;
      if ((uint)(o_local[1].field_4.i - (int)sbx_local) < 0xb) {
        *o_local = (cTValue)sbx_local;
        local_270 = (SBufExt *)lj_buf_more2((SBuf *)&o_local->gcr,0xb);
      }
      if (one == 0) {
        local_3e0 = '\0';
      }
      else {
        local_3e0 = (char)i._4_4_;
      }
      sbx_local = (SBufExt *)((long)&local_270->w + 1);
      *(char *)&local_270->w = (local_338 != 0) + '\b' + local_3e0;
      if (one != 0) {
        local_1bc = one;
        if (one < 0xe0) {
          local_1b8 = (SBufExt *)((long)&local_270->w + 2);
          *(char *)&sbx_local->w = (char)one;
          local_1b0 = local_1b8;
        }
        else {
          local_1b8 = sbx_local;
          local_1b0 = (SBufExt *)serialize_wu124_((char *)sbx_local,one);
        }
        sbx_local = local_1b0;
      }
      if (local_338 != 0) {
        local_1d0 = sbx_local;
        local_1d4 = local_338;
        if (local_338 < 0xe0) {
          local_1d0 = (SBufExt *)((long)&sbx_local->w + 1);
          *(char *)&sbx_local->w = (char)local_338;
          local_1c8 = local_1d0;
        }
        else {
          local_1c8 = (SBufExt *)serialize_wu124_((char *)sbx_local,local_338);
        }
        sbx_local = local_1c8;
      }
      if (one != 0) {
        lVar1 = *(long *)(_nhash + 0x10);
        uVar10 = (ulong)one;
        oe = (cTValue *)(*(long *)(_nhash + 0x10) + (ulong)(i._4_4_ >> 2) * 8);
        while (oe < (cTValue *)(lVar1 + uVar10 * 8)) {
          sbx_local = (SBufExt *)serialize_put((char *)sbx_local,(SBufExt *)&o_local->gcr,oe);
          oe = oe + 1;
        }
      }
      if (local_338 != 0) {
        dict_str = (GCtab *)(*(long *)(_nhash + 0x28) + (ulong)*(uint *)(_nhash + 0x34) * 0x18);
        uVar2 = o_local[6].u64;
        if (uVar2 == 0) {
          do {
            if ((dict_str->nextgc).gcptr64 != 0xffffffffffffffff) {
              sbx_local = (SBufExt *)
                          serialize_put((char *)sbx_local,(SBufExt *)&o_local->gcr,
                                        (cTValue *)&dict_str->marked);
              sbx_local = (SBufExt *)
                          serialize_put((char *)sbx_local,(SBufExt *)&o_local->gcr,
                                        (cTValue *)dict_str);
              local_338 = local_338 - 1;
              if (local_338 == 0) goto LAB_001a1d24;
            }
            dict_str = (GCtab *)&dict_str[-1].node;
          } while( true );
        }
        do {
          if ((dict_str->nextgc).gcptr64 != 0xffffffffffffffff) {
            uVar3 = *(undefined4 *)&dict_str->field_0xc;
            if ((int)uVar3 >> 0xf == -5) {
              uVar10._0_1_ = dict_str->marked;
              uVar10._1_1_ = dict_str->gct;
              uVar10._2_1_ = dict_str->nomm;
              uVar10._3_1_ = dict_str->colo;
              uVar10._4_4_ = *(undefined4 *)&dict_str->field_0xc;
              uVar10 = uVar10 & 0x7fffffffffff;
              n_3._4_4_ = *(uint *)(uVar10 + 0xc);
              local_130 = *(long *)(uVar2 + 0x28);
              _len_1 = (uint *)(local_130 + (ulong)(n_3._4_4_ & *(uint *)(uVar2 + 0x34)) * 0x18);
              do {
                local_120 = uVar2;
                if (((int)((long)*(undefined8 *)(_len_1 + 2) >> 0x2f) == -5) &&
                   ((*(ulong *)(_len_1 + 2) & 0x7fffffffffff) == uVar10)) {
                  uVar8 = *_len_1;
                  local_288 = sbx_local;
                  local_290 = o_local;
                  local_294 = 6;
                  if ((uint)(o_local[1].field_4.i - (int)sbx_local) < 6) {
                    *o_local = (cTValue)sbx_local;
                    local_288 = (SBufExt *)lj_buf_more2((SBuf *)&o_local->gcr,6);
                  }
                  sbx_local = (SBufExt *)((long)&local_288->w + 1);
                  *(char *)&local_288->w = '\x0f';
                  local_1ec = uVar8;
                  if (uVar8 < 0xe0) {
                    local_1e8 = (SBufExt *)((long)&local_288->w + 2);
                    *(char *)&sbx_local->w = (char)uVar8;
                    local_1e0 = local_1e8;
                  }
                  else {
                    local_1e8 = sbx_local;
                    local_1e0 = (SBufExt *)serialize_wu124_((char *)sbx_local,uVar8);
                  }
                  sbx_local = local_1e0;
                  goto LAB_001a1c43;
                }
                _len_1 = *(uint **)(_len_1 + 4);
              } while (_len_1 != (uint *)0x0);
              uVar8 = *(uint *)(uVar10 + 0x14);
              local_2ac = uVar8 + 5;
              local_2a0 = sbx_local;
              local_2a8 = o_local;
              if ((uint)(o_local[1].field_4.i - (int)sbx_local) < local_2ac) {
                *o_local = (cTValue)sbx_local;
                local_2a0 = (SBufExt *)lj_buf_more2((SBuf *)&o_local->gcr,local_2ac);
              }
              sbx_local = local_2a0;
              local_204 = uVar8 + 0x20;
              local_200 = local_2a0;
              if (local_204 < 0xe0) {
                local_200 = (SBufExt *)((long)&local_2a0->w + 1);
                *(char *)&local_2a0->w = (char)local_204;
                local_1f8 = local_200;
              }
              else {
                local_1f8 = (SBufExt *)serialize_wu124_((char *)local_2a0,local_204);
              }
              pSVar5 = local_1f8;
              sbx_local = local_1f8;
              local_170 = (void *)(uVar10 + 0x18);
              local_168 = local_1f8;
              local_174 = uVar8;
              memcpy(local_1f8,local_170,(ulong)uVar8);
              sbx_local = (SBufExt *)((long)&pSVar5->w + (ulong)local_174);
            }
            else {
              sbx_local = (SBufExt *)
                          serialize_put((char *)sbx_local,(SBufExt *)&o_local->gcr,
                                        (cTValue *)&dict_str->marked);
            }
LAB_001a1c43:
            sbx_local = (SBufExt *)
                        serialize_put((char *)sbx_local,(SBufExt *)&o_local->gcr,(cTValue *)dict_str
                                     );
            local_338 = local_338 - 1;
            if (local_338 == 0) break;
          }
          dict_str = (GCtab *)&dict_str[-1].node;
        } while( true );
      }
LAB_001a1d24:
      o_local[8].field_4.i = o_local[8].field_4.i + 1;
    }
    else if ((int)(o->field_4).it >> 0xf == -0xb) {
      cts_1 = (CTState *)((sbx->L).ptr64 & 0xfffffffffffffff8);
      local_f8 = (long *)cts_1->L[3].maxstack.ptr64;
      local_f8[2] = (long)cts_1;
      ct._4_4_ = (uint)*(ushort *)((o->u64 & 0x7fffffffffff) + 10);
      local_e8 = (uint *)(*local_f8 + (ulong)ct._4_4_ * 0x18);
      while (puVar6 = local_e8, *local_e8 >> 0x1c == 8) {
        local_48 = local_e8;
        local_34 = *local_e8 & 0xffff;
        local_40 = local_f8;
        local_30 = local_f8;
        local_24 = local_34;
        local_20 = local_f8;
        local_e8 = (uint *)(*local_f8 + (ulong)local_34 * 0x18);
      }
      uVar10 = o->u64;
      puVar11 = (undefined8 *)((uVar10 & 0x7fffffffffff) + 0x10);
      local_d8 = local_f8;
      local_54 = ct._4_4_;
      local_50 = local_f8;
      local_14 = ct._4_4_;
      local_10 = local_f8;
      if (((*local_e8 & 0xfc000000) == 0) && (local_e8[1] == 8)) {
        local_2c4 = 9;
        local_2b8 = w;
        if ((uint)((int)sbx->e - iVar4) < 9) {
          sbx->w = w;
          local_2c0 = sbx;
          local_2b8 = lj_buf_more2((SBuf *)sbx,9);
        }
        cVar7 = '\x10';
        if ((*puVar6 & 0x800000) != 0) {
          cVar7 = '\x11';
        }
        *local_2b8 = cVar7;
        *(undefined8 *)(local_2b8 + 1) = *puVar11;
        sbx_local = (SBufExt *)(local_2b8 + 9);
      }
      else {
        if (((*local_e8 & 0xf4000000) != 0x34000000) || (local_e8[1] != 0x10)) goto LAB_001a228e;
        local_2dc = 0x11;
        local_2d0 = w;
        if ((uint)((int)sbx->e - iVar4) < 0x11) {
          sbx->w = w;
          local_2d8 = sbx;
          local_2d0 = lj_buf_more2((SBuf *)sbx,0x11);
        }
        *local_2d0 = '\x12';
        *(undefined8 *)(local_2d0 + 1) = *puVar11;
        *(undefined8 *)(local_2d0 + 9) = *(undefined8 *)((uVar10 & 0x7fffffffffff) + 0x18);
        sbx_local = (SBufExt *)(local_2d0 + 0x11);
      }
    }
    else {
      if ((int)(o->field_4).it >> 0xf != -4) {
LAB_001a228e:
        if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff3) {
          local_3f4 = 0xd;
        }
        else {
          local_3f4 = (int)(o->field_4).it >> 0xf ^ 0xffffffff;
        }
        lj_err_callerv((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_BADENC,
                       lj_obj_itypename[local_3f4]);
      }
      local_b0 = *(long *)(((sbx->L).ptr64 & 0xfffffffffffffff8) + 0x10);
      uVar10 = o->u64;
      segmap = (uint32_t *)(uVar10 >> 0x27 & 0xff);
      local_d0 = *(long *)(local_b0 + 0x70);
      uVar12 = (ulong)*(uint *)(local_d0 + (long)segmap * 4) << 0x20 | uVar10 & 0x7fffffffff;
      w_local._4_4_ = 9;
      local_2e8 = w;
      if ((uint)((int)sbx->e - iVar4) < 9) {
        sbx->w = w;
        local_2f0 = sbx;
        seg = uVar10;
        u = (uint64_t)o;
        local_2e8 = lj_buf_more2((SBuf *)sbx,9);
      }
      if (uVar12 == 0) {
        sbx_local = (SBufExt *)(local_2e8 + 1);
        *local_2e8 = '\x03';
      }
      else if (uVar12 == (uVar10 & 0xffffffff)) {
        *local_2e8 = '\x04';
        local_3d0 = (undefined4)(uVar10 & 0x7fffffffff);
        *(undefined4 *)(local_2e8 + 1) = local_3d0;
        sbx_local = (SBufExt *)(local_2e8 + 5);
      }
      else {
        *local_2e8 = '\x05';
        *(ulong *)(local_2e8 + 1) = uVar12;
        sbx_local = (SBufExt *)(local_2e8 + 9);
      }
    }
  }
  else {
    local_24c = 1;
    local_240 = (byte *)w;
    if ((int)sbx->e == iVar4) {
      sbx->w = w;
      local_248 = sbx;
      local_240 = (byte *)lj_buf_more2((SBuf *)sbx,1);
    }
    sbx_local = (SBufExt *)(local_240 + 1);
    *local_240 = (byte)(int)((long)(str->nextgc).gcptr64 >> 0x2f) ^ 0xff;
  }
  return (char *)sbx_local;
}

Assistant:

static char *serialize_put(char *w, SBufExt *sbx, cTValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    w = serialize_more(w, sbx, 5+len);
    w = serialize_wu124(w, SER_TAG_STR + len);
    w = lj_buf_wmem(w, strdata(str), len);
  } else if (tvisint(o)) {
    uint32_t x = LJ_BE ? lj_bswap((uint32_t)intV(o)) : (uint32_t)intV(o);
    w = serialize_more(w, sbx, 1+4);
    *w++ = SER_TAG_INT; memcpy(w, &x, 4); w += 4;
  } else if (tvisnum(o)) {
    uint64_t x = LJ_BE ? lj_bswap64(o->u64) : o->u64;
    w = serialize_more(w, sbx, 1+sizeof(lua_Number));
    *w++ = SER_TAG_NUM; memcpy(w, &x, 8); w += 8;
  } else if (tvispri(o)) {
    w = serialize_more(w, sbx, 1);
    *w++ = (char)(SER_TAG_NIL + ~itype(o));
  } else if (tvistab(o)) {
    const GCtab *t = tabV(o);
    uint32_t narray = 0, nhash = 0, one = 2;
    if (sbx->depth <= 0) lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DEPTH);
    sbx->depth--;
    if (t->asize > 0) {  /* Determine max. length of array part. */
      ptrdiff_t i;
      TValue *array = tvref(t->array);
      for (i = (ptrdiff_t)t->asize-1; i >= 0; i--)
	if (!tvisnil(&array[i]))
	  break;
      narray = (uint32_t)(i+1);
      if (narray && tvisnil(&array[0])) one = 4;
    }
    if (t->hmask > 0) {  /* Count number of used hash slots. */
      uint32_t i, hmask = t->hmask;
      Node *node = noderef(t->node);
      for (i = 0; i <= hmask; i++)
	nhash += !tvisnil(&node[i].val);
    }
    /* Write metatable index. */
    if (LJ_UNLIKELY(tabref(sbx->dict_mt)) && tabref(t->metatable)) {
      TValue mto;
      Node *n;
      settabV(sbufL(sbx), &mto, tabref(t->metatable));
      n = hashgcref(tabref(sbx->dict_mt), mto.gcr);
      do {
	if (n->key.u64 == mto.u64) {
	  uint32_t idx = n->val.u32.lo;
	  w = serialize_more(w, sbx, 1+5);
	  *w++ = SER_TAG_DICT_MT;
	  w = serialize_wu124(w, idx);
	  break;
	}
      } while ((n = nextnode(n)));
    }
    /* Write number of array slots and hash slots. */
    w = serialize_more(w, sbx, 1+2*5);
    *w++ = (char)(SER_TAG_TAB + (nhash ? 1 : 0) + (narray ? one : 0));
    if (narray) w = serialize_wu124(w, narray);
    if (nhash) w = serialize_wu124(w, nhash);
    if (narray) {  /* Write array entries. */
      cTValue *oa = tvref(t->array) + (one >> 2);
      cTValue *oe = tvref(t->array) + narray;
      while (oa < oe) w = serialize_put(w, sbx, oa++);
    }
    if (nhash) {  /* Write hash entries. */
      const Node *node = noderef(t->node) + t->hmask;
      GCtab *dict_str = tabref(sbx->dict_str);
      if (LJ_UNLIKELY(dict_str)) {
	for (;; node--)
	  if (!tvisnil(&node->val)) {
	    if (LJ_LIKELY(tvisstr(&node->key))) {
	      /* Inlined lj_tab_getstr is 30% faster. */
	      const GCstr *str = strV(&node->key);
	      Node *n = hashstr(dict_str, str);
	      do {
		if (tvisstr(&n->key) && strV(&n->key) == str) {
		  uint32_t idx = n->val.u32.lo;
		  w = serialize_more(w, sbx, 1+5);
		  *w++ = SER_TAG_DICT_STR;
		  w = serialize_wu124(w, idx);
		  break;
		}
		n = nextnode(n);
		if (!n) {
		  MSize len = str->len;
		  w = serialize_more(w, sbx, 5+len);
		  w = serialize_wu124(w, SER_TAG_STR + len);
		  w = lj_buf_wmem(w, strdata(str), len);
		  break;
		}
	      } while (1);
	    } else {
	      w = serialize_put(w, sbx, &node->key);
	    }
	    w = serialize_put(w, sbx, &node->val);
	    if (--nhash == 0) break;
	  }
      } else {
	for (;; node--)
	  if (!tvisnil(&node->val)) {
	    w = serialize_put(w, sbx, &node->key);
	    w = serialize_put(w, sbx, &node->val);
	    if (--nhash == 0) break;
	  }
      }
    }
    sbx->depth++;
#if LJ_HASFFI
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(sbufL(sbx));
    CType *s = ctype_raw(cts, cdataV(o)->ctypeid);
    uint8_t *sp = cdataptr(cdataV(o));
    if (ctype_isinteger(s->info) && s->size == 8) {
      w = serialize_more(w, sbx, 1+8);
      *w++ = (s->info & CTF_UNSIGNED) ? SER_TAG_UINT64 : SER_TAG_INT64;
#if LJ_BE
      { uint64_t u = lj_bswap64(*(uint64_t *)sp); memcpy(w, &u, 8); }
#else
      memcpy(w, sp, 8);
#endif
      w += 8;
    } else if (ctype_iscomplex(s->info) && s->size == 16) {
      w = serialize_more(w, sbx, 1+16);
      *w++ = SER_TAG_COMPLEX;
#if LJ_BE
      {  /* Only swap the doubles. The re/im order stays the same. */
	uint64_t u = lj_bswap64(((uint64_t *)sp)[0]); memcpy(w, &u, 8);
	u = lj_bswap64(((uint64_t *)sp)[1]); memcpy(w+8, &u, 8);
      }
#else
      memcpy(w, sp, 16);
#endif
      w += 16;
    } else {
      goto badenc;  /* NYI other cdata */
    }
#endif
  } else if (tvislightud(o)) {
    uintptr_t ud = (uintptr_t)lightudV(G(sbufL(sbx)), o);
    w = serialize_more(w, sbx, 1+sizeof(ud));
    if (ud == 0) {
      *w++ = SER_TAG_NULL;
    } else if (LJ_32 || checku32(ud)) {
#if LJ_BE && LJ_64
      ud = lj_bswap64(ud);
#elif LJ_BE
      ud = lj_bswap(ud);
#endif
      *w++ = SER_TAG_LIGHTUD32; memcpy(w, &ud, 4); w += 4;
#if LJ_64
    } else {
#if LJ_BE
      ud = lj_bswap64(ud);
#endif
      *w++ = SER_TAG_LIGHTUD64; memcpy(w, &ud, 8); w += 8;
#endif
    }
  } else {
    /* NYI userdata */
#if LJ_HASFFI
  badenc:
#endif
    lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADENC, lj_typename(o));
  }
  return w;
}